

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O1

void djgm_release(djg_mesh *mesh)

{
  if (mesh != (djg_mesh *)0x0) {
    free(mesh->vertexv);
    free(mesh->poly3v);
    free(mesh->poly4v);
    free(mesh);
    return;
  }
  __assert_fail("mesh",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/dj_opengl/dj_opengl.h"
                ,0x717,"void djgm_release(djg_mesh *)");
}

Assistant:

DJGDEF void djgm_release(djg_mesh *mesh)
{
    DJG_ASSERT(mesh);
    DJG_FREE(mesh->vertexv);
    DJG_FREE(mesh->poly3v);
    DJG_FREE(mesh->poly4v);
    DJG_FREE(mesh);
}